

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

quaternion * dja::operator*=(quaternion *a,float_t *b)

{
  quaternion qVar1;
  undefined8 local_28;
  undefined8 local_20;
  float_t *b_local;
  quaternion *a_local;
  
  qVar1 = operator*(a,*b);
  local_28 = qVar1._0_8_;
  a->re = (float_t)(undefined4)local_28;
  (a->im).x = (float_t)local_28._4_4_;
  local_20 = qVar1.im._4_8_;
  (a->im).y = (float_t)(undefined4)local_20;
  (a->im).z = (float_t)local_20._4_4_;
  return a;
}

Assistant:

Q normalize(const Q& q) {return Q(normalize(V4(q)));}